

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter.c
# Opt level: O0

void xml_reporter_start_suite(TestReporter *reporter,char *suitename,int count)

{
  long *plVar1;
  int iVar2;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  xmlDocPtr pxVar6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  long lVar9;
  long in_RDI;
  xmlChar *xml_suite_path;
  FILE *out;
  xml_suite_context *ctx;
  XmlMemo_conflict *memo;
  int segment_decrementer;
  char filename [4096];
  char *in_stack_ffffffffffffefa8;
  TestReporter *in_stack_ffffffffffffefb0;
  _func_void_char_ptr_void_ptr *in_stack_ffffffffffffefb8;
  char *pcVar10;
  CgreenBreadcrumb *in_stack_ffffffffffffefc0;
  char local_1018 [8];
  char *in_stack_ffffffffffffeff0;
  
  plVar1 = *(long **)(in_RDI + 0x88);
  if (99 < context_stack_p) {
    abort();
  }
  lVar9 = (long)context_stack_p;
  context_stack_p = context_stack_p + 1;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0x58) = 0;
  suite_path[0] = '\0';
  walk_breadcrumb(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
  add_suite_name((char *)in_stack_ffffffffffffefb0);
  iVar2 = snprintf(local_1018,0x1000,"%s-%s.xml",file_prefix,suite_path);
  if (0xfff < iVar2) {
    fprintf(_stderr,"filename truncated; exceeds PATH_MAX (= %d)\n",0x1000);
    exit(1);
  }
  if ((code *)*plVar1 == default_printer) {
    pFVar3 = fopen(local_1018,"w");
    if (pFVar3 == (FILE *)0x0) {
      pcVar10 = local_1018;
      pFVar3 = _stderr;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar3,"could not open %s: %s\r\n",pcVar10,pcVar5);
      exit(1);
    }
    context_stack[lVar9].outFile = (FILE *)pFVar3;
  }
  context_stack[lVar9].suite_duration = 0;
  pxVar6 = (xmlDocPtr)xmlNewDoc("1.0");
  context_stack[lVar9].doc = pxVar6;
  pxVar7 = (xmlNodePtr)xmlNewNode(0,"testsuite");
  context_stack[lVar9].suite = pxVar7;
  pxVar8 = xmlEscapePropValue(in_stack_ffffffffffffeff0);
  xmlNewProp(context_stack[lVar9].suite,"name",pxVar8);
  (*_xmlFree)(pxVar8);
  xmlDocSetRootElement(context_stack[lVar9].doc,context_stack[lVar9].suite);
  reporter_start_suite(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,0);
  return;
}

Assistant:

static void xml_reporter_start_suite(TestReporter *reporter, const char *suitename, int count) {
    char filename[PATH_MAX];
    int segment_decrementer = reporter->breadcrumb->depth;
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    FILE *out;

    (void)count;                /* UNUSED */

    reporter->passes = 0;
    reporter->failures = 0;
    reporter->skips = 0;
    reporter->exceptions = 0;

    suite_path[0] = '\0';
    walk_breadcrumb(reporter->breadcrumb, strcat_path_segment, &segment_decrementer);
    add_suite_name(suitename);

    if (snprintf(filename, sizeof(filename), "%s-%s.xml", file_prefix, suite_path) < 0)
        PANIC("Error when creating output filename");

    if (memo->printer == fprintf) {
        // If we're really printing to files, then open one...
        out = fopen(filename, "w");
        if (!out) {
            memo->printer(stderr, "could not open %s: %s\r\n", filename, strerror(errno));
            exit(EXIT_FAILURE);
        }
    } else
        out = stdout;

    file_stack[file_stack_p++] = out;
    memo->printer(out, "<?xml version=\"1.0\" encoding=\"ISO-8859-1\" ?>\n");
    memo->printer(out, indent(reporter));
    memo->printer(out, "<testsuite name=\"%s\">\n", suite_path);
    reporter_start_suite(reporter, suitename, 0);
}